

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intervals.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
wasm::IntervalProcessor::filterOverlaps
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<wasm::Interval,_std::allocator<wasm::Interval>_> *intervals)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  iterator __position;
  long lVar4;
  pointer ppVar5;
  pointer pIVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  pair<wasm::Interval,_int> *candidate;
  pair<wasm::Interval,_int> *ppVar10;
  int *__args;
  pointer ppVar11;
  pair<wasm::Interval,_int> *ppStack_68;
  vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
  intIntervals;
  undefined1 auStack_48 [8];
  vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_> kept;
  
  pIVar6 = (intervals->super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((intervals->super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>)._M_impl.
      super__Vector_impl_data._M_finish == pIVar6) {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    ppStack_68 = (pair<wasm::Interval,_int> *)0x0;
    intIntervals.
    super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    intIntervals.
    super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar7 = 0;
    do {
      uVar1 = pIVar6[uVar7].weight;
      auStack_48._0_4_ = pIVar6[uVar7].start;
      auStack_48._4_4_ = pIVar6[uVar7].end;
      iVar9 = (int)uVar7;
      kept.
      super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar9,uVar1);
      if (intIntervals.
          super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          intIntervals.
          super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<std::pair<wasm::Interval,int>,std::allocator<std::pair<wasm::Interval,int>>>::
        _M_realloc_insert<std::pair<wasm::Interval,int>>
                  ((vector<std::pair<wasm::Interval,int>,std::allocator<std::pair<wasm::Interval,int>>>
                    *)&ppStack_68,
                   (iterator)
                   intIntervals.
                   super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,(pair<wasm::Interval,_int> *)auStack_48
                  );
      }
      else {
        ((intIntervals.
          super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->first).start = auStack_48._0_4_;
        ((intIntervals.
          super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->first).end = auStack_48._4_4_;
        ((intIntervals.
          super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->first).weight = uVar1;
        (intIntervals.
         super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->second = iVar9;
        intIntervals.
        super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             intIntervals.
             super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
      }
      ppVar10 = ppStack_68;
      uVar7 = (ulong)(iVar9 + 1);
      pIVar6 = (intervals->super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(intervals->super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar6 >> 2) *
              -0x5555555555555555;
    } while (uVar7 <= uVar8 && uVar8 - uVar7 != 0);
    if (ppStack_68 !=
        intIntervals.
        super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar7 = (long)intIntervals.
                    super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)ppStack_68 >> 4;
      lVar4 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<wasm::Interval,int>*,std::vector<std::pair<wasm::Interval,int>,std::allocator<std::pair<wasm::Interval,int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (ppStack_68,
                 intIntervals.
                 super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<wasm::Interval,int>*,std::vector<std::pair<wasm::Interval,int>,std::allocator<std::pair<wasm::Interval,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (ppVar10);
    }
    auStack_48 = (undefined1  [8])0x0;
    kept.
    super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    kept.
    super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<std::pair<wasm::Interval,int>,std::allocator<std::pair<wasm::Interval,int>>>::
    _M_realloc_insert<std::pair<wasm::Interval,int>const&>
              ((vector<std::pair<wasm::Interval,int>,std::allocator<std::pair<wasm::Interval,int>>>
                *)auStack_48,(iterator)0x0,ppStack_68);
    ppVar5 = intIntervals.
             super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (ppStack_68 !=
        intIntervals.
        super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      ppVar10 = ppStack_68;
      do {
        uVar1 = kept.
                super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start[-1].first.end;
        if ((ppVar10->first).start < uVar1) {
          uVar2 = kept.
                  super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[-1].first.weight;
          uVar3 = (ppVar10->first).weight;
          if (((uVar2 == uVar3) && ((ppVar10->first).end < uVar1)) || (uVar2 < uVar3)) {
            kept.
            super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[-1].first.weight = (ppVar10->first).weight;
            uVar1 = (ppVar10->first).end;
            kept.
            super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[-1].first.start = (ppVar10->first).start;
            kept.
            super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[-1].first.end = uVar1;
            kept.
            super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[-1].second = ppVar10->second;
          }
        }
        else if (kept.
                 super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
                 kept.
                 super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
          std::vector<std::pair<wasm::Interval,int>,std::allocator<std::pair<wasm::Interval,int>>>::
          _M_realloc_insert<std::pair<wasm::Interval,int>const&>
                    ((vector<std::pair<wasm::Interval,int>,std::allocator<std::pair<wasm::Interval,int>>>
                      *)auStack_48,
                     (iterator)
                     kept.
                     super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,ppVar10);
        }
        else {
          uVar1 = (ppVar10->first).end;
          uVar2 = (ppVar10->first).weight;
          iVar9 = ppVar10->second;
          ((kept.
            super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->first).start = (ppVar10->first).start;
          ((kept.
            super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->first).end = uVar1;
          ((kept.
            super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->first).weight = uVar2;
          (kept.
           super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->second = iVar9;
          kept.
          super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               kept.
               super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        ppVar10 = ppVar10 + 1;
      } while (ppVar10 != ppVar5);
    }
    ppVar5 = kept.
             super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (auStack_48 !=
        (undefined1  [8])
        kept.
        super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __args = (int *)((long)auStack_48 + 0xc);
      do {
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,__args);
        }
        else {
          *__position._M_current = *__args;
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        ppVar11 = (pointer)(__args + 1);
        __args = __args + 4;
      } while (ppVar11 != ppVar5);
    }
    if (auStack_48 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_48,
                      (long)kept.
                            super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
    }
    if (ppStack_68 != (pair<wasm::Interval,_int> *)0x0) {
      operator_delete(ppStack_68,
                      (long)intIntervals.
                            super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppStack_68);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int>
IntervalProcessor::filterOverlaps(std::vector<Interval>& intervals) {
  if (intervals.size() == 0) {
    return std::vector<int>();
  }

  std::vector<std::pair<Interval, int>> intIntervals;
  for (Index i = 0; i < intervals.size(); i++) {
    auto& interval = intervals[i];
    intIntervals.push_back({interval, i});
  }

  std::sort(intIntervals.begin(), intIntervals.end());

  std::vector<std::pair<Interval, int>> kept;
  kept.push_back(intIntervals[0]);
  for (auto& candidate : intIntervals) {
    auto& former = kept.back();
    if (former.first.end <= candidate.first.start) {
      kept.push_back(candidate);
      continue;
    }

    // When two intervals overlap with the same weight, prefer to keep the
    // interval that ends sooner under the presumption that it will overlap with
    // fewer subsequent intervals.
    if (former.first.weight == candidate.first.weight &&
        former.first.end > candidate.first.end) {
      former = candidate;
    } else if (former.first.weight < candidate.first.weight) {
      former = candidate;
    }
  }

  std::vector<int> result;
  for (auto& intPair : kept) {
    result.push_back(intPair.second);
  }

  return result;
}